

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDVertex::MinimumFaceEdgeCount(ON_SubDVertex *this)

{
  ON_SubDFace *pOVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  unsigned_short vfi;
  ulong uVar5;
  
  uVar3 = 0xffff;
  for (uVar5 = 0; uVar2 = (ushort)uVar3, this->m_face_count != uVar5; uVar5 = uVar5 + 1) {
    pOVar1 = this->m_faces[uVar5];
    uVar4 = uVar3;
    if ((pOVar1 != (ON_SubDFace *)0x0) &&
       (uVar4._0_2_ = pOVar1->m_edge_count, uVar4._2_2_ = pOVar1->m_edgex_capacity,
       uVar2 <= (ushort)(undefined2)uVar4)) {
      uVar4 = uVar3;
    }
    uVar3 = uVar4;
  }
  if (uVar2 == 0xffff) {
    uVar2 = 0;
  }
  return (uint)uVar2;
}

Assistant:

unsigned int ON_SubDVertex::MinimumFaceEdgeCount() const
{
  unsigned short min_count = 0xFFFFU;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_edge_count < min_count)
      min_count = f->m_edge_count;
  }
  return min_count < 0xFFFFU ? min_count : 0;
}